

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsUniformBlockCase.cpp
# Opt level: O2

void __thiscall deqp::gls::ub::ShaderInterface::~ShaderInterface(ShaderInterface *this)

{
  StructType *this_00;
  UniformBlock *this_01;
  pointer ppSVar1;
  pointer ppUVar2;
  
  for (ppSVar1 = (this->m_structs).
                 super__Vector_base<deqp::gls::ub::StructType_*,_std::allocator<deqp::gls::ub::StructType_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppSVar1 !=
      (this->m_structs).
      super__Vector_base<deqp::gls::ub::StructType_*,_std::allocator<deqp::gls::ub::StructType_*>_>.
      _M_impl.super__Vector_impl_data._M_finish; ppSVar1 = ppSVar1 + 1) {
    this_00 = *ppSVar1;
    if (this_00 != (StructType *)0x0) {
      StructType::~StructType(this_00);
    }
    operator_delete(this_00,0x38);
  }
  for (ppUVar2 = (this->m_uniformBlocks).
                 super__Vector_base<deqp::gls::ub::UniformBlock_*,_std::allocator<deqp::gls::ub::UniformBlock_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppUVar2 !=
      (this->m_uniformBlocks).
      super__Vector_base<deqp::gls::ub::UniformBlock_*,_std::allocator<deqp::gls::ub::UniformBlock_*>_>
      ._M_impl.super__Vector_impl_data._M_finish; ppUVar2 = ppUVar2 + 1) {
    this_01 = *ppUVar2;
    if (this_01 != (UniformBlock *)0x0) {
      UniformBlock::~UniformBlock(this_01);
    }
    operator_delete(this_01,0x60);
  }
  std::_Vector_base<deqp::gls::ub::UniformBlock_*,_std::allocator<deqp::gls::ub::UniformBlock_*>_>::
  ~_Vector_base(&(this->m_uniformBlocks).
                 super__Vector_base<deqp::gls::ub::UniformBlock_*,_std::allocator<deqp::gls::ub::UniformBlock_*>_>
               );
  std::_Vector_base<deqp::gls::ub::StructType_*,_std::allocator<deqp::gls::ub::StructType_*>_>::
  ~_Vector_base((_Vector_base<deqp::gls::ub::StructType_*,_std::allocator<deqp::gls::ub::StructType_*>_>
                 *)this);
  return;
}

Assistant:

ShaderInterface::~ShaderInterface (void)
{
	for (std::vector<StructType*>::iterator i = m_structs.begin(); i != m_structs.end(); i++)
		delete *i;

	for (std::vector<UniformBlock*>::iterator i = m_uniformBlocks.begin(); i != m_uniformBlocks.end(); i++)
		delete *i;
}